

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O2

uint32_t __thiscall cppnet::BufferQueue::FindStr(BufferQueue *this,char *s,uint32_t s_len)

{
  int iVar1;
  uint32_t uVar2;
  shared_ptr<cppnet::BufferBlock> temp;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if ((this->_buffer_list)._size == 0) {
    uVar2 = 0;
  }
  else {
    std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               &(this->_buffer_list)._head.
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
    uVar2 = 0;
    while (local_50._M_ptr != (element_type *)0x0) {
      iVar1 = (*((local_50._M_ptr)->super_InnerBuffer).super_Buffer._vptr_Buffer[9])
                        (local_50._M_ptr,s,(ulong)s_len);
      if (iVar1 != 0) {
        uVar2 = uVar2 + iVar1;
        break;
      }
      if (local_50._M_ptr ==
          (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr) break;
      iVar1 = (*((local_50._M_ptr)->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
      uVar2 = uVar2 + iVar1;
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 &((local_50._M_ptr)->super_ListSlot<cppnet::BufferBlock>)._next.
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_50,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  return uVar2;
}

Assistant:

uint32_t BufferQueue::FindStr(const char* s, uint32_t s_len) {
    if (_buffer_list.Size() == 0) {
        return 0;
    }

    std::shared_ptr<BufferBlock> temp = _buffer_list.GetHead();
    uint32_t cur_len = 0;
    uint32_t can_read = 0;
    while (temp) {
        can_read = temp->FindStr(s, s_len);
        if (can_read > 0) {
            cur_len += can_read;
            break;
        }
        if (temp == _buffer_write) {
            break;
        }
        cur_len += temp->GetCanReadLength();
        temp = temp->GetNext();
    }
    return cur_len;
}